

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

shared_ptr<QPDFJob::CopyAttConfig> __thiscall QPDFJob::Config::copyAttachmentsFrom(Config *this)

{
  CopyAttConfig *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Config *in_RSI;
  shared_ptr<QPDFJob::CopyAttConfig> sVar1;
  Config *this_local;
  
  this_00 = (CopyAttConfig *)operator_new(0x68);
  CopyAttConfig::CopyAttConfig(this_00,in_RSI);
  std::shared_ptr<QPDFJob::CopyAttConfig>::shared_ptr<QPDFJob::CopyAttConfig,void>
            ((shared_ptr<QPDFJob::CopyAttConfig> *)this,this_00);
  sVar1.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<QPDFJob::CopyAttConfig>)
         sVar1.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFJob::CopyAttConfig>
QPDFJob::Config::copyAttachmentsFrom()
{
    return std::shared_ptr<CopyAttConfig>(new CopyAttConfig(this));
}